

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void close_func(LexState *ls)

{
  lua_State *L_00;
  FuncState *fs_00;
  Proto *pPVar1;
  TString **local_58;
  LocVar *local_50;
  Proto **local_48;
  TValue *local_40;
  int *local_38;
  Instruction *local_30;
  Proto *f;
  FuncState *fs;
  lua_State *L;
  LexState *ls_local;
  
  L_00 = ls->L;
  fs_00 = ls->fs;
  pPVar1 = fs_00->f;
  removevars(ls,0);
  luaK_ret(fs_00,0,0);
  if ((ulong)(long)(fs_00->pc + 1) < 0x4000000000000000) {
    local_30 = (Instruction *)
               luaM_realloc_(L_00,pPVar1->code,(long)pPVar1->sizecode << 2,(long)fs_00->pc << 2);
  }
  else {
    local_30 = (Instruction *)luaM_toobig(L_00);
  }
  pPVar1->code = local_30;
  pPVar1->sizecode = fs_00->pc;
  if ((ulong)(long)(fs_00->pc + 1) < 0x4000000000000000) {
    local_38 = (int *)luaM_realloc_(L_00,pPVar1->lineinfo,(long)pPVar1->sizelineinfo << 2,
                                    (long)fs_00->pc << 2);
  }
  else {
    local_38 = (int *)luaM_toobig(L_00);
  }
  pPVar1->lineinfo = local_38;
  pPVar1->sizelineinfo = fs_00->pc;
  if ((ulong)(long)(fs_00->nk + 1) < 0x1000000000000000) {
    local_40 = (TValue *)luaM_realloc_(L_00,pPVar1->k,(long)pPVar1->sizek << 4,(long)fs_00->nk << 4)
    ;
  }
  else {
    local_40 = (TValue *)luaM_toobig(L_00);
  }
  pPVar1->k = local_40;
  pPVar1->sizek = fs_00->nk;
  if ((ulong)(long)(fs_00->np + 1) < 0x2000000000000000) {
    local_48 = (Proto **)luaM_realloc_(L_00,pPVar1->p,(long)pPVar1->sizep << 3,(long)fs_00->np << 3)
    ;
  }
  else {
    local_48 = (Proto **)luaM_toobig(L_00);
  }
  pPVar1->p = local_48;
  pPVar1->sizep = fs_00->np;
  if ((ulong)(long)(fs_00->nlocvars + 1) < 0x1000000000000000) {
    local_50 = (LocVar *)
               luaM_realloc_(L_00,pPVar1->locvars,(long)pPVar1->sizelocvars << 4,
                             (long)fs_00->nlocvars << 4);
  }
  else {
    local_50 = (LocVar *)luaM_toobig(L_00);
  }
  pPVar1->locvars = local_50;
  pPVar1->sizelocvars = (int)fs_00->nlocvars;
  if ((ulong)(long)(int)(pPVar1->nups + 1) < 0x2000000000000000) {
    local_58 = (TString **)
               luaM_realloc_(L_00,pPVar1->upvalues,(long)pPVar1->sizeupvalues << 3,
                             (ulong)pPVar1->nups << 3);
  }
  else {
    local_58 = (TString **)luaM_toobig(L_00);
  }
  pPVar1->upvalues = local_58;
  pPVar1->sizeupvalues = (uint)pPVar1->nups;
  ls->fs = fs_00->prev;
  L_00->top = L_00->top + -2;
  if (fs_00 != (FuncState *)0x0) {
    anchor_token(ls);
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  removevars(ls, 0);
  luaK_ret(fs, 0, 0);  /* final return */
  luaM_reallocvector(L, f->code, f->sizecode, fs->pc, Instruction);
  f->sizecode = fs->pc;
  luaM_reallocvector(L, f->lineinfo, f->sizelineinfo, fs->pc, int);
  f->sizelineinfo = fs->pc;
  luaM_reallocvector(L, f->k, f->sizek, fs->nk, TValue);
  f->sizek = fs->nk;
  luaM_reallocvector(L, f->p, f->sizep, fs->np, Proto *);
  f->sizep = fs->np;
  luaM_reallocvector(L, f->locvars, f->sizelocvars, fs->nlocvars, LocVar);
  f->sizelocvars = fs->nlocvars;
  luaM_reallocvector(L, f->upvalues, f->sizeupvalues, f->nups, TString *);
  f->sizeupvalues = f->nups;
  lua_assert(luaG_checkcode(f));
  lua_assert(fs->bl == NULL);
  ls->fs = fs->prev;
  L->top -= 2;  /* remove table and prototype from the stack */
  /* last token read was anchored in defunct function; must reanchor it */
  if (fs) anchor_token(ls);
}